

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int __thiscall Board::place(Board *this,Block *block)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int t;
  bool base;
  int basenum;
  int *shape;
  int tmpY;
  int tmpX;
  int i;
  Block *block_local;
  Board *this_local;
  
  iVar1 = block->t;
  iVar2 = block->o;
  for (i = 0; i < 4; i = i + 1) {
    iVar3 = block->x + blockShape[iVar1][iVar2][i << 1];
    iVar4 = block->y + blockShape[iVar1][iVar2][i * 2 + 1];
    this->rows[iVar3] = 1 << ((byte)iVar4 & 0x1f) | this->rows[iVar3];
    this->cols[iVar4] = 1 << ((byte)iVar3 & 0x1f) | this->cols[iVar4];
  }
  basenum = 0;
  for (i = 0; i < 4; i = i + 1) {
    t = block->x + blockShape[iVar1][iVar2][i << 1];
    bVar5 = this->rows[t] == 0xfff;
    if (!bVar5) {
      do {
        t = t + -1;
        bVar5 = false;
        if (t != 0) {
          bVar5 = this->rows[t] == 0xfff;
        }
      } while (bVar5);
      bVar5 = (this->rows[t] >> ((char)block->y + (char)blockShape[iVar1][iVar2][i * 2 + 1] & 0x1fU)
              & 1U) != 0;
    }
    if (bVar5) {
      basenum = basenum + 1;
    }
  }
  return basenum;
}

Assistant:

int Board::place(const Block &block){
    int i, tmpX, tmpY;
    auto shape = blockShape[block.t][block.o];
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        rows[tmpX] |= 1 << tmpY;
        cols[tmpY] |= 1 << tmpX;
    }
    int basenum =0;
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        bool base = rows[tmpX] == FULL_ROW;
        if (!base)
        {
            int t = tmpX - 1;
            while (t && rows[t] == FULL_ROW)
                --t;
            base = ((rows[t]>>tmpY)&1);
        }
        if (base)
            ++basenum;
    }
    return basenum;
}